

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
* getReadWriteFile(ErrorOr<std::unique_ptr<llvm::WriteThroughMemoryBuffer,_std::default_delete<llvm::WriteThroughMemoryBuffer>_>_>
                   *__return_storage_ptr__,Twine *Filename,uint64_t FileSize,uint64_t MapSize,
                  uint64_t Offset)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long *plVar4;
  char *pcVar5;
  bool bVar6;
  error_code eVar7;
  int FD;
  error_code EC;
  file_status Status;
  int local_98;
  int local_94;
  error_code local_90;
  uint64_t local_80;
  file_status local_78;
  
  eVar7 = llvm::sys::fs::openFile(Filename,&local_98,CD_OpenExisting,FA_Write|FA_Read,F_None,0x1b6);
  local_90._M_cat = eVar7._M_cat;
  local_90._M_value = eVar7._M_value;
  if (local_90._M_value == 0) {
    if ((MapSize == 0xffffffffffffffff) && (MapSize = FileSize, FileSize == 0xffffffffffffffff)) {
      local_78.super_basic_file_status.fs_st_size._0_4_ = 0;
      local_78.super_basic_file_status.fs_st_size._4_4_ = 0;
      local_78.super_basic_file_status.Type = status_error;
      local_78.super_basic_file_status.fs_st_atime_nsec = 0;
      local_78.super_basic_file_status.fs_st_mtime_nsec = 0;
      local_78.super_basic_file_status.fs_st_uid = 0;
      local_78.super_basic_file_status.fs_st_gid = 0;
      local_78.super_basic_file_status.fs_st_atime = 0;
      local_78.super_basic_file_status.fs_st_mtime = 0;
      local_78.super_basic_file_status.Perms = perms_not_known;
      local_78.fs_st_dev = 0;
      local_78.fs_st_nlinks = 0;
      local_78.fs_st_ino = 0;
      eVar7 = llvm::sys::fs::status(local_98,&local_78);
      if (eVar7._M_value == 0) {
        bVar6 = local_78.super_basic_file_status.Type == block_file ||
                local_78.super_basic_file_status.Type == regular_file;
        if ((local_78.super_basic_file_status.Type == regular_file) ||
           (local_78.super_basic_file_status.Type == block_file)) {
          MapSize = CONCAT44(local_78.super_basic_file_status.fs_st_size._4_4_,
                             (undefined4)local_78.super_basic_file_status.fs_st_size);
        }
        else {
          uVar3 = std::_V2::generic_category();
          __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
          *(undefined4 *)&__return_storage_ptr__->field_0 = 0x16;
          *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar3;
          MapSize = 0xffffffffffffffff;
        }
      }
      else {
        __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
        *(int *)&__return_storage_ptr__->field_0 = eVar7._M_value;
        *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar7._M_cat;
        MapSize = 0xffffffffffffffff;
        bVar6 = false;
      }
      if (!bVar6) {
        return __return_storage_ptr__;
      }
    }
    local_80 = Offset;
    local_78.super_basic_file_status.fs_st_atime = (time_t)Filename;
    plVar4 = (long *)operator_new(0x30,(NamedBufferAlloc *)&local_78);
    local_94 = local_98;
    *plVar4 = (long)&PTR__MemoryBufferMMapFile_001e7d30;
    iVar1 = llvm::sys::fs::mapped_file_region::alignment();
    iVar2 = llvm::sys::fs::mapped_file_region::alignment();
    llvm::sys::fs::mapped_file_region::mapped_file_region
              ((mapped_file_region *)(plVar4 + 3),local_94,readwrite,
               ((long)(iVar1 + -1) & Offset) + MapSize,(long)-iVar2 & Offset,&local_90);
    if (local_90._M_value == 0) {
      pcVar5 = llvm::sys::fs::mapped_file_region::const_data((mapped_file_region *)(plVar4 + 3));
      iVar1 = llvm::sys::fs::mapped_file_region::alignment();
      plVar4[1] = (long)(pcVar5 + ((long)(iVar1 + -1) & local_80));
      plVar4[2] = (long)(pcVar5 + ((long)(iVar1 + -1) & local_80) + MapSize);
    }
    if (local_90._M_value == 0) {
      __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
      *(long **)&__return_storage_ptr__->field_0 = plVar4;
      plVar4 = (long *)0x0;
    }
    else {
      __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
      *(int *)&__return_storage_ptr__->field_0 = local_90._M_value;
      *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = local_90._M_cat;
    }
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))(plVar4);
    }
  }
  else {
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(int *)&__return_storage_ptr__->field_0 = local_90._M_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = local_90._M_cat;
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorOr<std::unique_ptr<WriteThroughMemoryBuffer>>
getReadWriteFile(const Twine &Filename, uint64_t FileSize, uint64_t MapSize,
                 uint64_t Offset) {
  int FD;
  std::error_code EC = sys::fs::openFileForReadWrite(
      Filename, FD, sys::fs::CD_OpenExisting, sys::fs::OF_None);

  if (EC)
    return EC;

  // Default is to map the full file.
  if (MapSize == uint64_t(-1)) {
    // If we don't know the file size, use fstat to find out.  fstat on an open
    // file descriptor is cheaper than stat on a random path.
    if (FileSize == uint64_t(-1)) {
      sys::fs::file_status Status;
      std::error_code EC = sys::fs::status(FD, Status);
      if (EC)
        return EC;

      // If this not a file or a block device (e.g. it's a named pipe
      // or character device), we can't mmap it, so error out.
      sys::fs::file_type Type = Status.type();
      if (Type != sys::fs::file_type::regular_file &&
          Type != sys::fs::file_type::block_file)
        return make_error_code(errc::invalid_argument);

      FileSize = Status.getSize();
    }
    MapSize = FileSize;
  }

  std::unique_ptr<WriteThroughMemoryBuffer> Result(
      new (NamedBufferAlloc(Filename))
          MemoryBufferMMapFile<WriteThroughMemoryBuffer>(false, FD, MapSize,
                                                         Offset, EC));
  if (EC)
    return EC;
  return std::move(Result);
}